

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Context *pCVar4;
  bool bVar5;
  TestNode *node;
  Texture2DFilteringCase *this_00;
  ulong uVar6;
  long lVar7;
  TextureCubeFilteringCase *this_01;
  long lVar8;
  byte bVar9;
  long lVar10;
  bool bVar11;
  allocator<char> local_1b9;
  uint local_1b8;
  uint local_1b4;
  TestNode *local_1b0;
  anon_struct_16_3_5cb0d78b *local_1a8;
  long local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  long local_188;
  long local_180;
  ulong local_178;
  anon_struct_16_2_3f8b7511 *local_170;
  ulong local_168;
  anon_struct_16_2_3f8b7511 *local_160;
  ulong local_158;
  anon_struct_16_2_3f8b7511 *local_150;
  TextureFilteringTests *local_148;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1b0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,local_1b0);
  tcu::TestNode::addChild((TestNode *)this,node);
  local_148 = this;
  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
    local_170 = init::minFilterModes + lVar7;
    uVar1 = init::minFilterModes[lVar7].mode;
    local_178 = (ulong)uVar1;
    local_1b8 = uVar1 & 0xfffffffe;
    local_198 = CONCAT44(local_198._4_4_,uVar1) & 0xfffffffffffffffe ^ 0x2600;
    for (local_1a0 = 0; local_1a0 != 2; local_1a0 = local_1a0 + 1) {
      local_160 = init::magFilterModes + local_1a0;
      local_168 = (ulong)init::magFilterModes[local_1a0].mode;
      local_1b4 = init::magFilterModes[local_1a0].mode ^ 0x2600;
      uVar6 = 0;
      while (uVar6 != 3) {
        local_150 = init::wrapModes + uVar6;
        uVar1 = init::wrapModes[uVar6].mode;
        local_158 = (ulong)uVar1;
        bVar5 = (int)local_198 == 0;
        local_188 = CONCAT71(local_188._1_7_,uVar1 == 0x2901 && local_1b4 == 0);
        lVar8 = 0;
        local_190 = uVar6;
        while (lVar8 != 2) {
          bVar9 = (lVar8 == 0 || local_1b8 == 0x2600) | (byte)local_188;
          local_1a8 = init::formats + lVar8;
          lVar10 = 0;
          local_180 = lVar8;
          while( true ) {
            if (lVar10 == 0x20) break;
            uVar2 = *(uint *)((long)&init::sizes2D[0].width + lVar10);
            if ((uVar2 & uVar2 - 1) == 0) {
              uVar3 = *(uint *)((long)&init::sizes2D[0].height + lVar10);
              bVar11 = (uVar3 & uVar3 - 1) == 0;
            }
            else {
              bVar11 = false;
            }
            if (((bVar11 | (uVar1 == 0x812f && bVar5)) & bVar9) == 1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,glcts::fixed_sample_locations_values + 1,&local_1b9);
              std::operator+(&local_f0,&local_110,local_170->name);
              std::operator+(&local_b0,&local_f0,"_");
              std::operator+(&local_70,&local_b0,local_160->name);
              std::operator+(&local_50,&local_70,"_");
              std::operator+(&local_d0,&local_50,local_150->name);
              std::operator+(&local_90,&local_d0,"_");
              std::operator+(&name,&local_90,local_1a8->name);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_110);
              if (local_1b8 == 0x2600) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d0,"_",(allocator<char> *)&local_50);
                std::operator+(&local_90,&local_d0,*(char **)((long)&init::sizes2D[0].name + lVar10)
                              );
                std::__cxx11::string::append((string *)&name);
                std::__cxx11::string::~string((string *)&local_90);
                std::__cxx11::string::~string((string *)&local_d0);
              }
              this_00 = (Texture2DFilteringCase *)operator_new(0x128);
              pCVar4 = (local_148->super_TestCaseGroup).m_context;
              Texture2DFilteringCase::Texture2DFilteringCase
                        (this_00,(local_148->super_TestCaseGroup).super_TestCaseGroup.super_TestNode
                                 .m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                         name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                         (deUint32)local_178,(deUint32)local_168,(deUint32)local_158,
                         (deUint32)local_158,0x1908,local_1a8->dataType,uVar2,
                         *(int *)((long)&init::sizes2D[0].height + lVar10));
              tcu::TestNode::addChild(local_1b0,(TestNode *)this_00);
              std::__cxx11::string::~string((string *)&name);
            }
            lVar10 = lVar10 + 0x10;
          }
          lVar8 = local_180 + 1;
        }
        uVar6 = local_190 + 1;
      }
    }
  }
  for (local_1a0 = 0; local_1a0 != 6; local_1a0 = local_1a0 + 1) {
    local_1b0 = (TestNode *)(init::minFilterModes + local_1a0);
    local_170 = (anon_struct_16_2_3f8b7511 *)(ulong)init::minFilterModes[local_1a0].mode;
    local_1b8 = init::minFilterModes[local_1a0].mode & 0xfffffffe;
    local_1b4 = local_1b8 ^ 0x2600;
    for (local_198 = 0; local_198 != 2; local_198 = local_198 + 1) {
      local_160 = init::magFilterModes + local_198;
      local_168 = (ulong)init::magFilterModes[local_198].mode;
      local_190 = CONCAT44(local_190._4_4_,init::magFilterModes[local_198].mode) ^ 0x2600;
      for (local_188 = 0; local_188 != 3; local_188 = local_188 + 1) {
        local_150 = init::wrapModes + local_188;
        uVar1 = init::wrapModes[local_188].mode;
        local_158 = (ulong)uVar1;
        bVar5 = local_1b4 == 0;
        local_180 = CONCAT71(local_180._1_7_,uVar1 == 0x2901 && (int)local_190 == 0);
        for (local_178 = 0; local_178 != 2; local_178 = local_178 + 1) {
          bVar9 = (local_178 == 0 || local_1b8 == 0x2600) | (byte)local_180;
          local_1a8 = init::formats + local_178;
          lVar7 = 0;
          while( true ) {
            if (lVar7 == 0x20) break;
            uVar2 = *(uint *)((long)&init::sizesCube[0].width + lVar7);
            if ((uVar2 & uVar2 - 1) == 0) {
              uVar3 = *(uint *)((long)&init::sizesCube[0].height + lVar7);
              bVar11 = (uVar3 & uVar3 - 1) == 0;
            }
            else {
              bVar11 = false;
            }
            if (((bVar11 | (uVar1 == 0x812f && bVar5)) & bVar9) == 1) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,glcts::fixed_sample_locations_values + 1,&local_1b9);
              std::operator+(&local_f0,&local_110,(char *)local_1b0->_vptr_TestNode);
              std::operator+(&local_b0,&local_f0,"_");
              std::operator+(&local_70,&local_b0,local_160->name);
              std::operator+(&local_50,&local_70,"_");
              std::operator+(&local_d0,&local_50,local_150->name);
              std::operator+(&local_90,&local_d0,"_");
              std::operator+(&name,&local_90,local_1a8->name);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_110);
              if (local_1b8 == 0x2600) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_d0,"_",(allocator<char> *)&local_50);
                std::operator+(&local_90,&local_d0,
                               *(char **)((long)&init::sizesCube[0].name + lVar7));
                std::__cxx11::string::append((string *)&name);
                std::__cxx11::string::~string((string *)&local_90);
                std::__cxx11::string::~string((string *)&local_d0);
              }
              this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
              pCVar4 = (local_148->super_TestCaseGroup).m_context;
              TextureCubeFilteringCase::TextureCubeFilteringCase
                        (this_01,(local_148->super_TestCaseGroup).super_TestCaseGroup.super_TestNode
                                 .m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                         name._M_dataplus._M_p,glcts::fixed_sample_locations_values + 1,
                         (deUint32)local_170,(deUint32)local_168,(deUint32)local_158,
                         (deUint32)local_158,0x1908,local_1a8->dataType,uVar2,
                         *(int *)((long)&init::sizesCube[0].height + lVar7));
              tcu::TestNode::addChild(node,(TestNode *)this_01);
              std::__cxx11::string::~string((string *)&name);
            }
            lVar7 = lVar7 + 0x10;
          }
        }
      }
    }
  }
  return 6;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE			},
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizes2D[size].width) && deIsPowerOfTwo32(sizes2D[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if ((format != 0) && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format, formats[format].dataType,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizesCube[size].width) && deIsPowerOfTwo32(sizesCube[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if (format != 0 && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 formats[format].format, formats[format].dataType,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}